

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dig.c
# Opt level: O1

int dig(void)

{
  undefined1 *puVar1;
  char cVar2;
  byte bVar3;
  xchar x;
  xchar y;
  level *plVar4;
  boolean bVar5;
  schar sVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  obj *poVar11;
  trap *ptVar12;
  char *pcVar13;
  monst *pmVar14;
  uint uVar15;
  int x_00;
  long lVar16;
  long lVar17;
  char *pcVar18;
  long lVar19;
  char *pcVar20;
  char *pcVar21;
  bool bVar22;
  
  plVar4 = level;
  bVar22 = true;
  if ((uwep != (obj *)0x0) && ((byte)(uwep->oclass | 4U) == 6)) {
    bVar22 = objects[uwep->otyp].oc_subtyp != '\x04';
  }
  if (uwep == (obj *)0x0) {
    pcVar20 = "dig into";
  }
  else if ((byte)(uwep->oclass | 4U) == 6) {
    pcVar20 = "chop through";
    if (objects[uwep->otyp].oc_subtyp == '\x04') {
      pcVar20 = "dig into";
    }
  }
  else {
    pcVar20 = "chop through";
  }
  if (uwep == (obj *)0x0) {
    return 0;
  }
  if ((u._1052_1_ & 1) != 0) {
    return 0;
  }
  x = digging.pos.x;
  lVar16 = (long)digging.pos.x;
  y = digging.pos.y;
  lVar17 = (long)digging.pos.y;
  if (bVar22) {
    if ((byte)(uwep->oclass | 4U) != 6) {
      return 0;
    }
    if (objects[uwep->otyp].oc_subtyp != '\x03') {
      return 0;
    }
  }
  bVar5 = on_level(&digging.level,&u.uz);
  if (bVar5 == '\0') {
    return 0;
  }
  if (digging.down == '\0') {
    iVar10 = dist2((int)x,(int)y,(int)u.ux,(int)u.uy);
    if (2 < iVar10) {
      return 0;
    }
  }
  else {
    if (x != u.ux) {
      return 0;
    }
    if (y != u.uy) {
      return 0;
    }
  }
  iVar10 = (int)y;
  if (digging.down == '\0') {
    cVar2 = plVar4->locations[lVar16][lVar17].typ;
    if ((((cVar2 == '\r') || (cVar2 == '\x0e')) ||
        ((cVar2 == '\0' & ((level->flags).field_0xa & 0x10) >> 4) != 0)) &&
       ((bVar5 = may_dig(level,x,y), bVar5 == '\0' && (iVar9 = dig_typ(uwep,x,y), iVar9 == 5)))) {
      pcVar20 = "This tree seems to be petrified.";
      goto LAB_00163fe6;
    }
    if ((((plVar4->locations[lVar16][lVar17].typ < '\x11') &&
         (bVar5 = may_dig(level,x,y), bVar5 == '\0')) && (iVar9 = dig_typ(uwep,x,y), iVar9 == 1)) ||
       ((plVar4->locations[lVar16][lVar17].typ == '\x17' &&
        (iVar9 = artifact_door(level,(int)x,iVar10), iVar9 != 0)))) {
      pcVar21 = "wall";
      if (plVar4->locations[lVar16][lVar17].typ == '\x17') {
        pcVar21 = "door";
      }
      pcVar18 = "This %s is too hard to %s.";
      goto LAB_00163c8c;
    }
  }
  else {
    bVar5 = dig_check(&youmonst,'\x01',(int)u.ux,(int)u.uy);
    if (bVar5 == '\0') {
      return 0;
    }
  }
  if ((u.uprops[0x25].extrinsic != 0 || u.uprops[0x25].intrinsic != 0) &&
     (uVar7 = mt_random(), uVar7 * -0x55555555 < 0x55555556)) {
    uVar7 = mt_random();
    if (uVar7 % 3 == 1) {
      pcVar20 = xname(uwep);
      pcVar20 = the(pcVar20);
      pline("Bang!  You hit with the broad side of %s!",pcVar20);
      return 0;
    }
    if (uVar7 % 3 == 0) {
      iVar10 = welded(uwep);
      pmVar14 = u.usteed;
      if (iVar10 != 0) {
        pcVar20 = xname(uwep);
        pcVar21 = otense(uwep,"bounce");
        pcVar18 = otense(uwep,"hit");
        if (pmVar14 == (monst *)0x0) {
          pline("Ouch!  Your %s %s and %s you!",pcVar20,pcVar21,pcVar18);
        }
        else {
          pcVar13 = mon_nam(u.usteed);
          pline("Your %s %s and %s %s!",pcVar20,pcVar21,pcVar18,pcVar13);
        }
        uVar7 = mt_random();
        set_wounded_legs(0x40000,uVar7 % 5 + 6);
        return 0;
      }
      pcVar20 = xname(uwep);
      pline("You fumble and drop your %s.",pcVar20);
      dropx(uwep);
      return 0;
    }
    pcVar20 = "Your swing misses its mark.";
LAB_00163fe6:
    pline(pcVar20);
    return 0;
  }
  uVar8 = mt_random();
  iVar9 = abon();
  uVar15 = *(uint *)&uwep->field_0x4a >> 8 & 3;
  uVar7 = *(uint *)&uwep->field_0x4a >> 10 & 3;
  if (uVar7 < uVar15) {
    uVar7 = uVar15;
  }
  iVar9 = (((int)u.udaminc + iVar9 + uVar8 % 5 + (int)uwep->spe + digging.effort) - uVar7) + 10;
  if (urace.malenum == 0x2d) {
    iVar9 = iVar9 * 2;
  }
  if (plVar4->locations[lVar16][lVar17].typ == '\x0e') {
    iVar9 = iVar9 << 1;
  }
  digging.effort = iVar9;
  x_00 = (int)x;
  if (digging.down != '\0') {
    if (0xfa < iVar9) {
      dighole('\0');
      digging.effort = 0;
      digging.lastdigtime = 0;
      digging.level.dnum = '\0';
      digging.level.dlevel = '\0';
      digging.pos.x = '\0';
      digging.pos.y = '\0';
      digging.down = '\0';
      digging.chew = '\0';
      digging.warned = '\0';
      digging.quiet = '\0';
      return 0;
    }
    if (iVar9 < 0x33) {
      return 1;
    }
    ptVar12 = t_at(level,x_00,iVar10);
    if ((ptVar12 != (trap *)0x0) && ((byte)((ptVar12->field_0x8 & 0x1f) - 0xb) < 4)) {
      return 1;
    }
    if (plVar4->locations[lVar16][lVar17].typ == '!') {
      altar_wrath(x_00,iVar10);
      angry_priest();
    }
    bVar5 = dighole('\x01');
    if (bVar5 == '\0') {
      return 0;
    }
    digging.level.dnum = '\0';
    digging.level.dlevel = -1;
    return 0;
  }
  if (iVar9 < 0x65) {
    uVar7 = dig_typ(uwep,x,y);
    cVar2 = plVar4->locations[lVar16][lVar17].typ;
    if (((cVar2 == '\0') || ('\f' < cVar2)) && (uVar7 != 4)) {
      if (('\x10' < cVar2) && (uVar7 == 1)) {
        return 0;
      }
    }
    else {
      pcVar21 = in_rooms(level,x,y,0x12);
      if (*pcVar21 != '\0') {
        pcVar21 = "wall";
        if (plVar4->locations[lVar16][lVar17].typ == '\x17') {
          pcVar21 = "door";
        }
        pcVar18 = "This %s seems too hard to %s.";
LAB_00163c8c:
        pline(pcVar18,pcVar21,pcVar20);
        return 0;
      }
    }
    if (did_dig_msg == '\0') {
      pline("You hit the %s with all your might.",
            dig_d_target_rel + *(int *)(dig_d_target_rel + (ulong)uVar7 * 4));
      did_dig_msg = 1;
      return 1;
    }
    return 1;
  }
  pcVar20 = in_rooms(level,x,y,0x12);
  cVar2 = *pcVar20;
  poVar11 = sobj_at(0x215,level,x_00,iVar10);
  if (poVar11 == (obj *)0x0) {
    poVar11 = sobj_at(0x214,level,x_00,iVar10);
    if (poVar11 == (obj *)0x0) {
      bVar3 = plVar4->locations[lVar16][lVar17].typ;
      if (((0x10 < bVar3) || ((0x12001U >> (bVar3 & 0x1f) & 1) == 0)) && (bVar3 != 0xe)) {
        if ((char)bVar3 < '\r') {
          if (cVar2 == '\0') {
            pcVar21 = (char *)0x0;
          }
          else {
            sVar6 = acurrstr();
            add_damage(x,y,(long)sVar6 * 10);
            pcVar21 = "damage";
          }
          uVar7 = *(uint *)&(level->flags).field_0x8;
          if ((uVar7 >> 0x11 & 1) == 0) {
            if (((uVar7 >> 0x13 & 1) == 0) || (bVar5 = in_town(x_00,(int)y), bVar5 != '\0')) {
              plVar4->locations[lVar16][lVar17].typ = '\x17';
              puVar1 = &plVar4->locations[lVar16][lVar17].field_0x6;
              *(uint *)puVar1 = *(uint *)puVar1 & 0xfffffe0f;
            }
            else {
              plVar4->locations[lVar16][lVar17].typ = '\x18';
            }
          }
          else {
            plVar4->locations[lVar16][lVar17].typ = '\x19';
          }
          bVar22 = false;
          pcVar20 = "You make an opening in the wall.";
        }
        else if (bVar3 == 0xf) {
          cvt_sdoor_to_door(plVar4->locations[lVar16] + lVar17,&u.uz);
          uVar7 = *(uint *)&plVar4->locations[lVar16][lVar17].field_0x6;
          if ((uVar7 >> 8 & 1) == 0) {
            *(uint *)&plVar4->locations[lVar16][lVar17].field_0x6 = uVar7 & 0xfffffe0f | 0x10;
          }
          pcVar21 = (char *)0x0;
          bVar22 = false;
          pcVar20 = "You break through a secret door!";
        }
        else {
          bVar5 = closed_door(level,x_00,iVar10);
          if (bVar5 == '\0') {
            return 0;
          }
          if (cVar2 == '\0') {
            pcVar21 = (char *)0x0;
          }
          else {
            add_damage(x,y,400);
            pcVar21 = "break";
          }
          uVar7 = *(uint *)&plVar4->locations[lVar16][lVar17].field_0x6;
          if ((uVar7 >> 8 & 1) == 0) {
            *(uint *)&plVar4->locations[lVar16][lVar17].field_0x6 = uVar7 & 0xfffffe0f | 0x10;
          }
          bVar22 = false;
          pcVar20 = "You break through the door.";
        }
        goto LAB_001641d7;
      }
      bVar5 = on_level(&u.uz,&dungeon_topology.d_earth_level);
      if (bVar5 != '\0') {
        if (((uwep->field_0x4a & 2) == 0) || (uVar7 = mt_random(), 0x55555555 < uVar7 * -0x55555555)
           ) {
          if ((((uwep->field_0x4a & 1) == 0) || (uVar7 = mt_random(), (uVar7 & 3) != 0)) &&
             (((uwep->field_0x4a & 2) != 0 ||
              (uVar7 = mt_random(),
              0x2aaaaaaa <
              (uVar7 * -0x55555555 >> 1 | (uint)((uVar7 * -0x55555555 & 1) != 0) << 0x1f)))))
          goto LAB_0016411e;
          bVar5 = '\x01';
        }
        else {
          bVar5 = '\0';
        }
        mkcavearea(bVar5);
        goto LAB_00164330;
      }
LAB_0016411e:
      cVar2 = plVar4->locations[lVar16][lVar17].typ;
      if ((cVar2 == '\r') ||
         ((cVar2 == '\x0e' || ((cVar2 == '\0' & ((level->flags).field_0xa & 0x10) >> 4) != 0)))) {
        plVar4->locations[lVar16][lVar17].typ = '\x19';
        uVar7 = mt_random();
        pcVar20 = "You cut down the tree.";
        if (uVar7 * -0x33333333 < 0x33333334) {
          rnd_treefruit_at(x_00,iVar10);
        }
      }
      else {
        plVar4->locations[lVar16][lVar17].typ = '\x18';
        pcVar20 = "You succeed in cutting away some rock.";
      }
    }
    else {
      fracture_rock(poVar11);
      poVar11 = sobj_at(0x214,level,x_00,iVar10);
      pcVar20 = "The boulder falls apart.";
      if (poVar11 != (obj *)0x0) {
        obj_extract_self(poVar11);
        place_object(poVar11,level,x_00,iVar10);
      }
    }
    pcVar21 = (char *)0x0;
    bVar22 = false;
  }
  else {
    bVar5 = break_statue(poVar11);
    pcVar21 = (char *)0x0;
    bVar22 = bVar5 == '\0';
    pcVar20 = "The statue shatters.";
    if (bVar22) {
      pcVar20 = pcVar21;
    }
  }
LAB_001641d7:
  iVar10 = (int)x;
  iVar9 = (int)y;
  bVar5 = does_block(level,iVar10,iVar9,(monst *)0x0);
  if (bVar5 == '\0') {
    unblock_point(iVar10,iVar9);
  }
  if (((u.uprops[0x1e].intrinsic == 0) &&
      (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
       (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
     ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
    newsym(iVar10,iVar9);
  }
  else {
    feel_location(x,y);
  }
  if (!bVar22 && digging.quiet == '\0') {
    pline(pcVar20);
  }
  if (pcVar21 != (char *)0x0) {
    pay_for_damage(pcVar21,'\0');
  }
  bVar5 = on_level(&u.uz,&dungeon_topology.d_earth_level);
  if ((bVar5 != '\0') && (uVar7 = mt_random(), uVar7 * -0x55555555 < 0x55555556)) {
    uVar7 = mt_random();
    lVar19 = 0x3b80;
    if ((uVar7 & 1) == 0) {
      lVar19 = 0x2840;
    }
    pmVar14 = makemon((permonst *)((long)&((permonst *)(mons[0].mattk + -4))->mname + lVar19),level,
                      iVar10,iVar9,0);
    if (pmVar14 != (monst *)0x0) {
      pline("The debris from your digging comes to life!");
    }
  }
  if ((plVar4->locations[lVar16][lVar17].typ == '\x17') &&
     (uVar7 = *(uint *)&plVar4->locations[lVar16][lVar17].field_0x6, (uVar7 >> 8 & 1) != 0)) {
    *(uint *)&plVar4->locations[lVar16][lVar17].field_0x6 = uVar7 & 0xfffffe0f;
    b_trapped("door",0);
    newsym(iVar10,iVar9);
  }
LAB_00164330:
  digging.lastdigtime = moves;
  digging._10_6_ = digging._10_6_ & 0xffffffffff;
  digging.level.dnum = '\0';
  digging.level.dlevel = -1;
  return 0;
}

Assistant:

static int dig(void)
{
	struct rm *loc;
	xchar dpx = digging.pos.x, dpy = digging.pos.y;
	boolean ispick = uwep && is_pick(uwep);
	const char *verb =
	    (!uwep || is_pick(uwep)) ? "dig into" : "chop through";

	loc = &level->locations[dpx][dpy];
	/* perhaps a nymph stole your pick-axe while you were busy digging */
	/* or perhaps you teleported away */
	if (u.uswallow || !uwep || (!ispick && !is_axe(uwep)) ||
	    !on_level(&digging.level, &u.uz) ||
	    ((digging.down ? (dpx != u.ux || dpy != u.uy)
			   : (distu(dpx,dpy) > 2))))
		return 0;

	if (digging.down) {
	    if (!dig_check(BY_YOU, TRUE, u.ux, u.uy)) return 0;
	} else { /* !digging.down */
	    if (IS_TREES(level, loc->typ) && !may_dig(level, dpx,dpy) &&
			dig_typ(uwep, dpx, dpy) == DIGTYP_TREE) {
		pline("This tree seems to be petrified.");
		return 0;
	    }
	    /* ALI - Artifact doors */
	    if ((IS_ROCK(loc->typ) && !may_dig(level, dpx,dpy) &&
			dig_typ(uwep, dpx, dpy) == DIGTYP_ROCK) ||
			(IS_DOOR(loc->typ) && artifact_door(level, dpx, dpy))) {
		pline("This %s is too hard to %s.",
		      IS_DOOR(loc->typ) ? "door" : "wall", verb);
		return 0;
	    }
	}
	if (Fumbling && !rn2(3)) {
	    switch(rn2(3)) {
	    case 0:
		if (!welded(uwep)) {
		    pline("You fumble and drop your %s.", xname(uwep));
		    dropx(uwep);
		} else {
		    if (u.usteed)
			pline("Your %s %s and %s %s!",
			     xname(uwep),
			     otense(uwep, "bounce"), otense(uwep, "hit"),
			     mon_nam(u.usteed));
		    else
			pline("Ouch!  Your %s %s and %s you!",
			      xname(uwep),
			      otense(uwep, "bounce"), otense(uwep, "hit"));
		    set_wounded_legs(RIGHT_SIDE, 5 + rnd(5));
		}
		break;
	    case 1:
		pline("Bang!  You hit with the broad side of %s!",
		      the(xname(uwep)));
		break;
	    default: pline("Your swing misses its mark.");
		break;
	    }
	    return 0;
	}

	digging.effort += 10 + rn2(5) + abon() +
			   uwep->spe - greatest_erosion(uwep) + u.udaminc;
	if (Race_if(PM_DWARF))
	    digging.effort *= 2;
	if (loc->typ == DEADTREE)
	    digging.effort *= 2;
	if (digging.down) {
		struct trap *ttmp;

		if (digging.effort > 250) {
		    dighole(FALSE);
		    memset(&digging, 0, sizeof digging);
		    return 0;	/* done with digging */
		}

		if (digging.effort <= 50 ||
		    ((ttmp = t_at(level, dpx,dpy)) != 0 &&
			(ttmp->ttyp == PIT || ttmp->ttyp == SPIKED_PIT ||
			 ttmp->ttyp == TRAPDOOR || ttmp->ttyp == HOLE)))
		    return 1;

		if (IS_ALTAR(loc->typ)) {
		    altar_wrath(dpx, dpy);
		    angry_priest();
		}

		if (dighole(TRUE)) {	/* make pit at <u.ux,u.uy> */
		    digging.level.dnum = 0;
		    digging.level.dlevel = -1;
		}
		return 0;
	}

	if (digging.effort > 100) {
		const char *digtxt, *dmgtxt = NULL;
		struct obj *obj;
		boolean shopedge = *in_rooms(level, dpx, dpy, SHOPBASE);

		if ((obj = sobj_at(STATUE, level, dpx, dpy)) != 0) {
			if (break_statue(obj))
				digtxt = "The statue shatters.";
			else
				/* it was a statue trap; break_statue()
				 * printed a message and updated the screen
				 */
				digtxt = NULL;
		} else if ((obj = sobj_at(BOULDER, level, dpx, dpy)) != 0) {
			struct obj *bobj;

			fracture_rock(obj);
			if ((bobj = sobj_at(BOULDER, level, dpx, dpy)) != 0) {
			    /* another boulder here, restack it to the top */
			    obj_extract_self(bobj);
			    place_object(bobj, level, dpx, dpy);
			}
			digtxt = "The boulder falls apart.";
		} else if (loc->typ == STONE || loc->typ == SCORR ||
				IS_TREES(level, loc->typ)) {
			if (Is_earthlevel(&u.uz)) {
			    if (uwep->blessed && !rn2(3)) {
				mkcavearea(FALSE);
				goto cleanup;
			    } else if ((uwep->cursed && !rn2(4)) ||
					  (!uwep->blessed && !rn2(6))) {
				mkcavearea(TRUE);
				goto cleanup;
			    }
			}
			if (IS_TREES(level, loc->typ)) {
			    digtxt = "You cut down the tree.";
			    loc->typ = ROOM;
			    if (!rn2(5)) rnd_treefruit_at(dpx, dpy);
			} else {
			    digtxt = "You succeed in cutting away some rock.";
			    loc->typ = CORR;
			}
		} else if (IS_WALL(loc->typ)) {
			if (shopedge) {
			    add_damage(dpx, dpy, 10L * ACURRSTR);
			    dmgtxt = "damage";
			}
			if (level->flags.is_maze_lev) {
			    loc->typ = ROOM;
			} else if (level->flags.is_cavernous_lev &&
				   !in_town(dpx, dpy)) {
			    loc->typ = CORR;
			} else {
			    loc->typ = DOOR;
			    loc->doormask = D_NODOOR;
			}
			digtxt = "You make an opening in the wall.";
		} else if (loc->typ == SDOOR) {
			cvt_sdoor_to_door(loc, &u.uz);	/* ->typ = DOOR */
			digtxt = "You break through a secret door!";
			if (!(loc->doormask & D_TRAPPED))
				loc->doormask = D_BROKEN;
		} else if (closed_door(level, dpx, dpy)) {
			digtxt = "You break through the door.";
			if (shopedge) {
			    add_damage(dpx, dpy, 400L);
			    dmgtxt = "break";
			}
			if (!(loc->doormask & D_TRAPPED))
				loc->doormask = D_BROKEN;
		} else return 0; /* statue or boulder got taken */

		if (!does_block(level, dpx, dpy, NULL))
		    unblock_point(dpx,dpy);	/* vision:  can see through */
		if (Blind)
		    feel_location(dpx, dpy);
		else
		    newsym(dpx, dpy);
		if (digtxt && !digging.quiet) pline(digtxt); /* after newsym */
		if (dmgtxt)
		    pay_for_damage(dmgtxt, FALSE);

		if (Is_earthlevel(&u.uz) && !rn2(3)) {
		    struct monst *mtmp;

		    switch(rn2(2)) {
		      case 0:
			mtmp = makemon(&mons[PM_EARTH_ELEMENTAL], level,
					dpx, dpy, NO_MM_FLAGS);
			break;
		      default:
			mtmp = makemon(&mons[PM_XORN], level,
					dpx, dpy, NO_MM_FLAGS);
			break;
		    }
		    if (mtmp) pline("The debris from your digging comes to life!");
		}
		if (IS_DOOR(loc->typ) && (loc->doormask & D_TRAPPED)) {
			loc->doormask = D_NODOOR;
			b_trapped("door", 0);
			newsym(dpx, dpy);
		}
cleanup:
		digging.lastdigtime = moves;
		digging.quiet = FALSE;
		digging.level.dnum = 0;
		digging.level.dlevel = -1;
		return 0;
	} else {		/* not enough effort has been spent yet */
		static const char *const d_target[6] = {
			"", "rock", "statue", "boulder", "door", "tree"
		};
		int dig_target = dig_typ(uwep, dpx, dpy);

		if (IS_WALL(loc->typ) || dig_target == DIGTYP_DOOR) {
		    if (*in_rooms(level, dpx, dpy, SHOPBASE)) {
			pline("This %s seems too hard to %s.",
			      IS_DOOR(loc->typ) ? "door" : "wall", verb);
			return 0;
		    }
		} else if (!IS_ROCK(loc->typ) && dig_target == DIGTYP_ROCK)
		    return 0; /* statue or boulder got taken */
		if (!did_dig_msg) {
		    pline("You hit the %s with all your might.",
			d_target[dig_target]);
		    did_dig_msg = TRUE;
		}
	}
	return 1;
}